

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O2

void __thiscall
CaDiCaL::External::push_external_clause_and_witness_on_extension_stack
          (External *this,vector<int,_std::allocator<int>_> *c,vector<int,_std::allocator<int>_> *w,
          uint64_t id)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  int *elit_1;
  uint *puVar4;
  int *elit;
  int local_3c;
  uint64_t local_38;
  
  this_00 = &this->extension;
  local_3c = 0;
  local_38 = id;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  puVar2 = (uint *)(w->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar4 = (uint *)(w->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    uVar1 = *puVar4;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    init(this,(EVP_PKEY_CTX *)(ulong)uVar3);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict3 *)puVar4);
    mark(this,&this->witness,*puVar4);
  }
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = (int)local_38;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  puVar2 = (uint *)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar4 = (uint *)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    uVar1 = *puVar4;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    init(this,(EVP_PKEY_CTX *)(ulong)uVar3);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict3 *)puVar4);
  }
  return;
}

Assistant:

void External::push_external_clause_and_witness_on_extension_stack (
    const vector<int> &c, const vector<int> &w, uint64_t id) {
  assert (id);
  extension.push_back (0);
  for (const auto &elit : w) {
    assert (elit != INT_MIN);
    init (abs (elit));
    extension.push_back (elit);
    mark (witness, elit);
  }
  extension.push_back (0);
  const uint32_t higher_bits = static_cast<int> (id << 32);
  const uint32_t lower_bits = (id & (((uint64_t) 1 << 32) - 1));
  extension.push_back (higher_bits);
  extension.push_back (lower_bits);
  extension.push_back (0);
  for (const auto &elit : c) {
    assert (elit != INT_MIN);
    init (abs (elit));
    extension.push_back (elit);
  }
}